

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asmbbt.c
# Opt level: O1

void bitblt(DLword *srcbase,DLword *dstbase,int sx,int dx,int w,int h,int srcbpl,int dstbpl,
           int backwardflg,int src_comp,int op,int gray,int num_gray,int curr_gray_line)

{
  DLword *pDVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  sbyte sVar6;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  uint *puVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint *puVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  uint *puVar25;
  uint *puVar26;
  uint uVar27;
  uint local_ec;
  uint local_e8;
  uint local_e4;
  uint local_e0;
  uint local_dc;
  uint local_d8;
  uint local_d0;
  uint local_cc;
  uint local_c0;
  uint local_bc;
  uint *local_b8;
  DLword *local_b0;
  uint local_9c;
  uint local_98;
  uint local_94;
  int local_84;
  uint *local_80;
  uint *local_60;
  sbyte sVar7;
  
  if (gray == 0) {
    local_e0 = dstbpl | srcbpl;
    if (backwardflg == 0) {
      if (dx < 0) {
        uVar9 = -(ulong)(7U - dx >> 3);
      }
      else {
        uVar9 = (ulong)((uint)dx >> 3);
      }
      local_b8 = (uint *)((long)dstbase + uVar9);
      uVar19 = (dx & 7U) + ((uint)local_b8 & 3) * 8;
      local_bc = (w + uVar19) - 1 & 0x1f;
      local_e8 = -1 << (~(byte)local_bc & 0x1f);
      local_e4 = -(uint)(uVar19 == 0) | ~(-1 << (-(char)uVar19 & 0x1fU));
      if (sx < 0) {
        uVar9 = -(ulong)(7U - sx >> 3);
      }
      else {
        uVar9 = (ulong)((uint)sx >> 3);
      }
      local_c0 = local_e8 & local_e4;
      local_dc = ((int)(uVar19 + w) >> 5) - 1;
      local_80 = (uint *)(uVar9 + (long)srcbase & 0xfffffffffffffffc);
      uVar10 = (sx & 7U) + ((uint)(uVar9 + (long)srcbase) & 3) * 8;
      local_94 = (w + uVar10) - 1 & 0x1f;
      uVar4 = uVar10 - uVar19 & 0x1f;
      local_98 = uVar19 - uVar10 & 0x1f;
      local_9c = -(uint)(uVar4 == 0) | ~(-1 << (sbyte)uVar4);
    }
    else {
      uVar19 = (w + dx) - 1;
      if (w + dx < 1) {
        uVar9 = -(ulong)(8U - (w + dx) >> 3);
      }
      else {
        uVar9 = (ulong)(uVar19 >> 3);
      }
      local_b8 = (uint *)((long)dstbase + uVar9);
      local_bc = (uVar19 & 7) + ((uint)local_b8 & 3) * 8;
      iVar22 = local_bc - w;
      uVar19 = iVar22 + 1U & 0x1f;
      local_e4 = -1 << (~(byte)local_bc & 0x1f);
      local_e8 = -(uint)(uVar19 == 0) | ~(-1 << (-(char)uVar19 & 0x1fU));
      uVar10 = (local_bc ^ 0xffffffff) + w;
      local_dc = uVar10 >> 5;
      if ((int)uVar10 < 1) {
        local_dc = 0;
      }
      uVar10 = (w + sx) - 1;
      if (w + sx < 1) {
        uVar9 = -(ulong)(8U - (w + sx) >> 3);
      }
      else {
        uVar9 = (ulong)(uVar10 >> 3);
      }
      local_c0 = local_e8 & local_e4;
      local_80 = (uint *)(uVar9 + (long)srcbase & 0xfffffffffffffffc);
      local_94 = (uVar10 & 7) + ((uint)(uVar9 + (long)srcbase) & 3) * 8;
      iVar15 = local_94 - w;
      uVar10 = iVar15 + 1U & 0x1f;
      local_98 = iVar22 - iVar15 & 0x1f;
      uVar4 = iVar15 - iVar22 & 0x1f;
      local_9c = ~(-1 << (sbyte)uVar4);
    }
  }
  else {
    if (dx < 0) {
      uVar9 = -(ulong)(7U - dx >> 3);
    }
    else {
      uVar9 = (ulong)((uint)dx >> 3);
    }
    local_b8 = (uint *)((long)dstbase + uVar9);
    uVar19 = (dx & 7U) + ((uint)local_b8 & 3) * 8;
    local_bc = (w + uVar19) - 1 & 0x1f;
    uVar4 = 0;
    local_e8 = -1 << (~(byte)local_bc & 0x1f);
    local_e4 = -(uint)(uVar19 == 0) | ~(-1 << (-(char)uVar19 & 0x1fU));
    local_c0 = local_e8 & local_e4;
    local_dc = ((int)(uVar19 + w) >> 5) - 1;
    uVar10 = sx & 0xf;
    local_9c = 0;
    local_94 = 0;
    local_e0 = dstbpl;
    local_80 = (uint *)0x0;
    local_98 = 0;
  }
  if (h < 1) {
    return;
  }
  local_84 = curr_gray_line;
  local_b8 = (uint *)((ulong)local_b8 & 0xfffffffffffffffc);
  uVar3 = -(uint)(src_comp != 0);
  uVar23 = 0;
  puVar26 = local_80;
  local_b0 = srcbase;
LAB_0010a94e:
  local_d0 = local_c0;
  local_d8 = local_e8;
  local_cc = local_e4;
  local_60 = local_80;
  local_ec = local_9c;
  puVar25 = local_b8;
  iVar22 = h;
  uVar24 = local_98;
  uVar18 = local_94;
  uVar11 = local_bc;
  uVar13 = uVar19;
  uVar5 = uVar10;
  uVar12 = local_dc;
  do {
    puVar17 = puVar25;
    uVar8 = local_d0;
    if (gray == 0) {
      sVar6 = (sbyte)uVar24;
      sVar7 = (sbyte)uVar4;
      if (backwardflg == 0) {
        uVar14 = *puVar26;
        if ((int)(uVar5 + w) < 0x21 || uVar5 <= uVar13) {
          puVar26 = puVar26 + 1;
          if (uVar13 < uVar5) {
            uVar20 = uVar14 << sVar7;
          }
          else {
            uVar20 = uVar14 >> sVar6 & local_ec;
            uVar23 = ~local_ec & uVar14 << sVar7;
          }
        }
        else {
          puVar21 = puVar26 + 1;
          puVar26 = puVar26 + 2;
          uVar20 = *puVar21 >> sVar6 & local_ec | uVar14 << sVar7;
          uVar23 = ~local_ec & *puVar21 << sVar7;
        }
        uVar20 = uVar20 ^ uVar3;
        if ((int)(uVar13 + w) < 0x21) goto LAB_0010ac53;
        uVar8 = *puVar25;
        uVar14 = uVar8;
        switch(op) {
        case 0:
          break;
        case 1:
          uVar20 = uVar20 & uVar8;
          break;
        case 2:
          uVar20 = uVar20 | uVar8;
          break;
        case 3:
          uVar20 = uVar20 ^ uVar8;
          break;
        default:
          goto switchD_0010aef3_default;
        }
        uVar14 = uVar20;
switchD_0010aef3_default:
        *puVar25 = uVar14 & local_cc | uVar8 & ~local_cc;
        puVar17 = puVar25 + 1;
        if (uVar5 == uVar13) {
          if (src_comp == 0) {
            switch(op) {
            case 0:
              if (0 < (int)uVar12) {
                iVar15 = uVar12 + 1;
                do {
                  uVar8 = *puVar26;
                  puVar26 = puVar26 + 1;
                  *puVar17 = uVar8;
                  puVar17 = puVar17 + 1;
                  iVar15 = iVar15 + -1;
                } while (1 < iVar15);
              }
              break;
            case 1:
              if (0 < (int)uVar12) {
                iVar15 = uVar12 + 1;
                do {
                  *puVar17 = *puVar17 & *puVar26;
                  puVar26 = puVar26 + 1;
                  puVar17 = puVar17 + 1;
                  iVar15 = iVar15 + -1;
                } while (1 < iVar15);
              }
              break;
            case 2:
              if (0 < (int)uVar12) {
                iVar15 = uVar12 + 1;
                do {
                  *puVar17 = *puVar17 | *puVar26;
                  puVar26 = puVar26 + 1;
                  puVar17 = puVar17 + 1;
                  iVar15 = iVar15 + -1;
                } while (1 < iVar15);
              }
              break;
            case 3:
              if (0 < (int)uVar12) {
                iVar15 = uVar12 + 1;
                do {
                  *puVar17 = *puVar17 ^ *puVar26;
                  puVar26 = puVar26 + 1;
                  puVar17 = puVar17 + 1;
                  iVar15 = iVar15 + -1;
                } while (1 < iVar15);
              }
            }
          }
          else {
            switch(op) {
            case 0:
              if (0 < (int)uVar12) {
                iVar15 = uVar12 + 1;
                do {
                  uVar8 = *puVar26;
                  puVar26 = puVar26 + 1;
                  *puVar17 = ~uVar8;
                  puVar17 = puVar17 + 1;
                  iVar15 = iVar15 + -1;
                } while (1 < iVar15);
              }
              break;
            case 1:
              if (0 < (int)uVar12) {
                iVar15 = uVar12 + 1;
                do {
                  *puVar17 = *puVar17 & ~*puVar26;
                  puVar26 = puVar26 + 1;
                  puVar17 = puVar17 + 1;
                  iVar15 = iVar15 + -1;
                } while (1 < iVar15);
              }
              break;
            case 2:
              if (0 < (int)uVar12) {
                iVar15 = uVar12 + 1;
                do {
                  *puVar17 = *puVar17 | ~*puVar26;
                  puVar26 = puVar26 + 1;
                  puVar17 = puVar17 + 1;
                  iVar15 = iVar15 + -1;
                } while (1 < iVar15);
              }
              break;
            case 3:
              if (0 < (int)uVar12) {
                iVar15 = uVar12 + 1;
                do {
                  uVar8 = *puVar26;
                  puVar26 = puVar26 + 1;
                  *puVar17 = ~(uVar8 ^ *puVar17);
                  puVar17 = puVar17 + 1;
                  iVar15 = iVar15 + -1;
                } while (1 < iVar15);
              }
            }
          }
        }
        else if (src_comp == 0) {
          switch(op) {
          case 0:
            if (0 < (int)uVar12) {
              iVar15 = uVar12 + 1;
              do {
                uVar8 = *puVar26;
                puVar26 = puVar26 + 1;
                uVar14 = uVar8 >> sVar6 | uVar23;
                uVar23 = uVar8 << sVar7;
                *puVar17 = uVar14;
                puVar17 = puVar17 + 1;
                iVar15 = iVar15 + -1;
              } while (1 < iVar15);
            }
            break;
          case 1:
            if (0 < (int)uVar12) {
              iVar15 = uVar12 + 1;
              uVar8 = uVar23;
              do {
                uVar14 = *puVar26;
                puVar26 = puVar26 + 1;
                uVar23 = uVar14 << sVar7;
                *puVar17 = *puVar17 & (uVar14 >> sVar6 | uVar8);
                puVar17 = puVar17 + 1;
                iVar15 = iVar15 + -1;
                uVar8 = uVar23;
              } while (1 < iVar15);
            }
            break;
          case 2:
            if (0 < (int)uVar12) {
              iVar15 = uVar12 + 1;
              puVar21 = puVar17;
              uVar8 = uVar23;
              do {
                uVar14 = *puVar26;
                puVar26 = puVar26 + 1;
                uVar23 = uVar14 << sVar7;
                puVar17 = puVar21 + 1;
                *puVar21 = uVar8 | *puVar21 | uVar14 >> sVar6;
                iVar15 = iVar15 + -1;
                puVar21 = puVar17;
                uVar8 = uVar23;
              } while (1 < iVar15);
            }
            break;
          case 3:
            if (0 < (int)uVar12) {
              iVar15 = uVar12 + 1;
              uVar8 = uVar23;
              do {
                uVar14 = *puVar26;
                puVar26 = puVar26 + 1;
                uVar23 = uVar14 << sVar7;
                *puVar17 = *puVar17 ^ (uVar14 >> sVar6 | uVar8);
                puVar17 = puVar17 + 1;
                iVar15 = iVar15 + -1;
                uVar8 = uVar23;
              } while (1 < iVar15);
            }
          }
        }
        else {
          switch(op) {
          case 0:
            if (0 < (int)uVar12) {
              iVar15 = uVar12 + 1;
              do {
                uVar8 = *puVar26;
                puVar26 = puVar26 + 1;
                uVar14 = uVar8 >> sVar6 | uVar23;
                uVar23 = uVar8 << sVar7;
                *puVar17 = ~uVar14;
                puVar17 = puVar17 + 1;
                iVar15 = iVar15 + -1;
              } while (1 < iVar15);
            }
            break;
          case 1:
            if (0 < (int)uVar12) {
              iVar15 = uVar12 + 1;
              do {
                uVar8 = *puVar26;
                puVar26 = puVar26 + 1;
                uVar14 = uVar8 >> sVar6 | uVar23;
                uVar23 = uVar8 << sVar7;
                *puVar17 = *puVar17 & ~uVar14;
                puVar17 = puVar17 + 1;
                iVar15 = iVar15 + -1;
              } while (1 < iVar15);
            }
            break;
          case 2:
            if (0 < (int)uVar12) {
              iVar15 = uVar12 + 1;
              do {
                uVar8 = *puVar26;
                puVar26 = puVar26 + 1;
                uVar14 = uVar8 >> sVar6 | uVar23;
                uVar23 = uVar8 << sVar7;
                *puVar17 = *puVar17 | ~uVar14;
                puVar17 = puVar17 + 1;
                iVar15 = iVar15 + -1;
              } while (1 < iVar15);
            }
            break;
          case 3:
            if (0 < (int)uVar12) {
              iVar15 = uVar12 + 1;
              puVar21 = puVar17;
              do {
                uVar8 = *puVar26;
                puVar26 = puVar26 + 1;
                uVar14 = uVar8 >> sVar6 | uVar23;
                uVar23 = uVar8 << sVar7;
                puVar17 = puVar21 + 1;
                *puVar21 = ~(uVar14 ^ *puVar21);
                iVar15 = iVar15 + -1;
                puVar21 = puVar17;
              } while (1 < iVar15);
            }
          }
        }
        if (uVar11 == 0x1f) goto LAB_0010aca1;
        uVar20 = uVar23;
        if (uVar18 <= uVar11) {
          uVar8 = *puVar26 >> sVar6 & local_ec;
          goto LAB_0010b775;
        }
      }
      else {
        if (uVar18 < uVar11) {
          if ((int)(uVar13 + 1) < (int)(uVar5 + w)) {
            puVar21 = puVar26 + -1;
            uVar23 = *puVar26;
            puVar26 = puVar26 + -2;
            uVar20 = *puVar21 << sVar7 | uVar23 >> sVar6 & local_ec;
            uVar23 = *puVar21 >> sVar6 & local_ec;
          }
          else {
            if (uVar11 <= uVar18) goto LAB_0010abc5;
            uVar14 = *puVar26;
            puVar26 = puVar26 + -1;
            uVar20 = uVar14 >> sVar6 & local_ec;
          }
        }
        else {
LAB_0010abc5:
          uVar23 = *puVar26;
          puVar26 = puVar26 + -1;
          uVar20 = uVar23 << sVar7;
          uVar23 = uVar23 >> sVar6 & local_ec;
        }
        uVar20 = uVar20 ^ uVar3;
        if ((int)(uVar13 + w) < 0x21) goto LAB_0010ac53;
        uVar8 = *puVar25;
        uVar14 = uVar8;
        switch(op) {
        case 0:
          break;
        case 1:
          uVar20 = uVar20 & uVar8;
          break;
        case 2:
          uVar20 = uVar20 | uVar8;
          break;
        case 3:
          uVar20 = uVar20 ^ uVar8;
          break;
        default:
          goto switchD_0010ac16_default;
        }
        uVar14 = uVar20;
switchD_0010ac16_default:
        *puVar25 = uVar14 & local_cc | uVar8 & ~local_cc;
        puVar17 = puVar25 + -1;
        if (uVar5 == uVar13) {
          if (src_comp == 0) {
            switch(op) {
            case 0:
              if (0 < (int)uVar12) {
                iVar15 = uVar12 + 1;
                do {
                  uVar8 = *puVar26;
                  puVar26 = puVar26 + -1;
                  *puVar17 = uVar8;
                  puVar17 = puVar17 + -1;
                  iVar15 = iVar15 + -1;
                } while (1 < iVar15);
              }
              break;
            case 1:
              if (0 < (int)uVar12) {
                iVar15 = uVar12 + 1;
                do {
                  *puVar17 = *puVar17 & *puVar26;
                  puVar26 = puVar26 + -1;
                  puVar17 = puVar17 + -1;
                  iVar15 = iVar15 + -1;
                } while (1 < iVar15);
              }
              break;
            case 2:
              if (0 < (int)uVar12) {
                iVar15 = uVar12 + 1;
                do {
                  *puVar17 = *puVar17 | *puVar26;
                  puVar26 = puVar26 + -1;
                  puVar17 = puVar17 + -1;
                  iVar15 = iVar15 + -1;
                } while (1 < iVar15);
              }
              break;
            case 3:
              if (0 < (int)uVar12) {
                iVar15 = uVar12 + 1;
                do {
                  *puVar17 = *puVar17 ^ *puVar26;
                  puVar26 = puVar26 + -1;
                  puVar17 = puVar17 + -1;
                  iVar15 = iVar15 + -1;
                } while (1 < iVar15);
              }
            }
          }
          else {
            switch(op) {
            case 0:
              if (0 < (int)uVar12) {
                iVar15 = uVar12 + 1;
                do {
                  uVar8 = *puVar26;
                  puVar26 = puVar26 + -1;
                  *puVar17 = ~uVar8;
                  puVar17 = puVar17 + -1;
                  iVar15 = iVar15 + -1;
                } while (1 < iVar15);
              }
              break;
            case 1:
              if (0 < (int)uVar12) {
                iVar15 = uVar12 + 1;
                do {
                  *puVar17 = *puVar17 & ~*puVar26;
                  puVar26 = puVar26 + -1;
                  puVar17 = puVar17 + -1;
                  iVar15 = iVar15 + -1;
                } while (1 < iVar15);
              }
              break;
            case 2:
              if (0 < (int)uVar12) {
                iVar15 = uVar12 + 1;
                do {
                  *puVar17 = *puVar17 | ~*puVar26;
                  puVar26 = puVar26 + -1;
                  puVar17 = puVar17 + -1;
                  iVar15 = iVar15 + -1;
                } while (1 < iVar15);
              }
              break;
            case 3:
              if (0 < (int)uVar12) {
                iVar15 = uVar12 + 1;
                do {
                  uVar8 = *puVar26;
                  puVar26 = puVar26 + -1;
                  *puVar17 = ~(uVar8 ^ *puVar17);
                  puVar17 = puVar17 + -1;
                  iVar15 = iVar15 + -1;
                } while (1 < iVar15);
              }
            }
          }
        }
        else if (src_comp == 0) {
          switch(op) {
          case 0:
            if (0 < (int)uVar12) {
              iVar15 = uVar12 + 1;
              do {
                uVar8 = *puVar26;
                puVar26 = puVar26 + -1;
                uVar14 = uVar8 << sVar7 | uVar23;
                uVar23 = uVar8 >> sVar6;
                *puVar17 = uVar14;
                puVar17 = puVar17 + -1;
                iVar15 = iVar15 + -1;
              } while (1 < iVar15);
            }
            break;
          case 1:
            if (0 < (int)uVar12) {
              iVar15 = uVar12 + 1;
              uVar8 = uVar23;
              do {
                uVar14 = *puVar26;
                puVar26 = puVar26 + -1;
                uVar23 = uVar14 >> sVar6;
                *puVar17 = *puVar17 & (uVar14 << sVar7 | uVar8);
                puVar17 = puVar17 + -1;
                iVar15 = iVar15 + -1;
                uVar8 = uVar23;
              } while (1 < iVar15);
            }
            break;
          case 2:
            if (0 < (int)uVar12) {
              iVar15 = uVar12 + 1;
              puVar21 = puVar17;
              uVar8 = uVar23;
              do {
                uVar14 = *puVar26;
                puVar26 = puVar26 + -1;
                uVar23 = uVar14 >> sVar6;
                puVar17 = puVar21 + -1;
                *puVar21 = uVar8 | *puVar21 | uVar14 << sVar7;
                iVar15 = iVar15 + -1;
                puVar21 = puVar17;
                uVar8 = uVar23;
              } while (1 < iVar15);
            }
            break;
          case 3:
            if (0 < (int)uVar12) {
              iVar15 = uVar12 + 1;
              uVar8 = uVar23;
              do {
                uVar14 = *puVar26;
                puVar26 = puVar26 + -1;
                uVar23 = uVar14 >> sVar6;
                *puVar17 = *puVar17 ^ (uVar14 << sVar7 | uVar8);
                puVar17 = puVar17 + -1;
                iVar15 = iVar15 + -1;
                uVar8 = uVar23;
              } while (1 < iVar15);
            }
          }
        }
        else {
          switch(op) {
          case 0:
            if (0 < (int)uVar12) {
              iVar15 = uVar12 + 1;
              do {
                uVar8 = *puVar26;
                puVar26 = puVar26 + -1;
                uVar14 = uVar8 << sVar7 | uVar23;
                uVar23 = uVar8 >> sVar6;
                *puVar17 = ~uVar14;
                puVar17 = puVar17 + -1;
                iVar15 = iVar15 + -1;
              } while (1 < iVar15);
            }
            break;
          case 1:
            if (0 < (int)uVar12) {
              iVar15 = uVar12 + 1;
              do {
                uVar8 = *puVar26;
                puVar26 = puVar26 + -1;
                uVar14 = uVar8 << sVar7 | uVar23;
                uVar23 = uVar8 >> sVar6;
                *puVar17 = *puVar17 & ~uVar14;
                puVar17 = puVar17 + -1;
                iVar15 = iVar15 + -1;
              } while (1 < iVar15);
            }
            break;
          case 2:
            if (0 < (int)uVar12) {
              iVar15 = uVar12 + 1;
              do {
                uVar8 = *puVar26;
                puVar26 = puVar26 + -1;
                uVar14 = uVar8 << sVar7 | uVar23;
                uVar23 = uVar8 >> sVar6;
                *puVar17 = *puVar17 | ~uVar14;
                puVar17 = puVar17 + -1;
                iVar15 = iVar15 + -1;
              } while (1 < iVar15);
            }
            break;
          case 3:
            if (0 < (int)uVar12) {
              iVar15 = uVar12 + 1;
              puVar21 = puVar17;
              do {
                uVar8 = *puVar26;
                puVar26 = puVar26 + -1;
                uVar14 = uVar8 << sVar7 | uVar23;
                uVar23 = uVar8 >> sVar6;
                puVar17 = puVar21 + -1;
                *puVar21 = ~(uVar14 ^ *puVar21);
                iVar15 = iVar15 + -1;
                puVar21 = puVar17;
              } while (1 < iVar15);
            }
          }
        }
        if (uVar13 == 0) goto LAB_0010aca1;
        uVar20 = uVar23;
        if (uVar13 <= uVar5) {
          uVar8 = *puVar26 << sVar7;
LAB_0010b775:
          uVar20 = uVar8 | uVar23;
        }
      }
      uVar20 = uVar20 ^ uVar3;
      uVar8 = local_d8;
LAB_0010ac53:
      uVar14 = *puVar17;
      uVar27 = uVar14;
      switch(op) {
      case 0:
        break;
      case 1:
        uVar20 = uVar20 & uVar14;
        break;
      case 2:
        uVar20 = uVar20 | uVar14;
        break;
      case 3:
        uVar20 = uVar20 ^ uVar14;
        break;
      default:
        goto switchD_0010ac77_default;
      }
      uVar27 = uVar20;
switchD_0010ac77_default:
      *puVar17 = uVar14 & ~uVar8 | uVar27 & uVar8;
    }
    else {
      uVar4 = uVar5 - uVar13 & 0xf;
      uVar14 = CONCAT22(*local_b0,*local_b0) << (sbyte)uVar4;
      uVar20 = (uVar14 >> 0x10 | uVar14) ^ uVar3;
      if ((int)(uVar13 + w) < 0x21) goto LAB_0010ac53;
      uVar8 = *puVar25;
      uVar14 = uVar8;
      switch(op) {
      case 0:
        uVar14 = uVar20;
        break;
      case 1:
        uVar14 = uVar8 & uVar20;
        break;
      case 2:
        uVar14 = uVar8 | uVar20;
        break;
      case 3:
        uVar14 = uVar8 ^ uVar20;
      }
      *puVar25 = uVar14 & local_cc | uVar8 & ~local_cc;
      puVar17 = puVar25 + 1;
      switch(op) {
      case 0:
        if (0 < (int)uVar12) {
          iVar15 = uVar12 + 1;
          do {
            *puVar17 = uVar20;
            puVar17 = puVar17 + 1;
            iVar15 = iVar15 + -1;
          } while (1 < iVar15);
        }
        break;
      case 1:
        if (0 < (int)uVar12) {
          iVar15 = uVar12 + 1;
          do {
            *puVar17 = *puVar17 & uVar20;
            puVar17 = puVar17 + 1;
            iVar15 = iVar15 + -1;
          } while (1 < iVar15);
        }
        break;
      case 2:
        if (0 < (int)uVar12) {
          iVar15 = uVar12 + 1;
          do {
            *puVar17 = *puVar17 | uVar20;
            puVar17 = puVar17 + 1;
            iVar15 = iVar15 + -1;
          } while (1 < iVar15);
        }
        break;
      case 3:
        if (0 < (int)uVar12) {
          iVar15 = uVar12 + 1;
          do {
            *puVar17 = *puVar17 ^ uVar20;
            puVar17 = puVar17 + 1;
            iVar15 = iVar15 + -1;
          } while (1 < iVar15);
        }
      }
      uVar8 = local_d8;
      if (uVar11 != 0x1f) goto LAB_0010ac53;
    }
LAB_0010aca1:
    if (gray != 0) break;
    if (backwardflg == 0) {
      uVar8 = dstbpl;
      if ((local_e0 & 0x1f) != 0) {
        uVar8 = uVar13 + dstbpl;
        uVar13 = uVar8 & 0x1f;
        uVar11 = (uVar13 + w) - 1 & 0x1f;
        local_cc = -(uint)(uVar13 == 0) | ~(-1 << (-(char)uVar13 & 0x1fU));
        local_d8 = -1 << (~(byte)uVar11 & 0x1f);
        local_d0 = local_d8 & local_cc;
        uVar12 = ((int)(uVar13 + w) >> 5) - 1;
      }
      uVar14 = srcbpl;
      if ((local_e0 & 0x1f) != 0) {
        uVar14 = uVar5 + srcbpl;
        uVar5 = uVar14 & 0x1f;
        uVar18 = w + 0x1f + uVar14 & 0x1f;
        uVar4 = uVar14 - uVar13 & 0x1f;
        uVar24 = uVar13 - uVar14 & 0x1f;
        local_ec = -(uint)(uVar4 == 0) | ~(-1 << (sbyte)uVar4);
      }
      lVar16 = (long)((int)uVar8 >> 5);
      uVar9 = (long)((int)uVar14 >> 5);
    }
    else {
      lVar16 = (long)(dstbpl >> 5);
      if ((local_e0 & 0x1f) != 0) {
        uVar12 = uVar11 + dstbpl;
        lVar16 = -(ulong)(0x1f - uVar12 >> 5);
        if (-1 < (int)uVar12) {
          lVar16 = 0;
        }
        uVar11 = uVar12 & 0x1f;
        local_cc = -1 << (~(byte)uVar11 & 0x1f);
        uVar13 = (uVar12 - w) + 1 & 0x1f;
        local_d8 = -(uint)(uVar13 == 0) | ~(-1 << (-(char)uVar13 & 0x1fU));
        local_d0 = local_d8 & local_cc;
        uVar8 = (uVar11 ^ 0xffffffff) + w;
        uVar12 = uVar8 >> 5;
        if ((int)uVar8 < 1) {
          uVar12 = 0;
        }
      }
      uVar9 = (long)(srcbpl >> 5);
      if ((local_e0 & 0x1f) != 0) {
        uVar4 = uVar18 + srcbpl;
        uVar9 = (ulong)(uVar4 >> 5);
        if ((int)uVar4 < 0) {
          uVar9 = -(ulong)(0x1f - uVar4 >> 5);
        }
        uVar18 = uVar4 & 0x1f;
        uVar24 = (uVar4 - w) + 1;
        uVar5 = uVar24 & 0x1f;
        uVar4 = uVar24 - uVar13 & 0x1f;
        uVar24 = uVar13 - uVar24 & 0x1f;
        local_ec = ~(-1 << (sbyte)uVar4);
      }
    }
    puVar25 = puVar25 + lVar16;
    puVar26 = local_60 + uVar9;
    bVar2 = iVar22 < 2;
    iVar22 = iVar22 + -1;
    local_60 = puVar26;
    if (bVar2) {
      return;
    }
  } while( true );
  uVar5 = dstbpl;
  if ((local_e0 & 0x1f) != 0) {
    uVar5 = uVar19 + dstbpl;
    uVar19 = uVar5 & 0x1f;
    local_bc = (uVar19 + w) - 1 & 0x1f;
    local_e4 = -(uint)(uVar19 == 0) | ~(-1 << (-(char)uVar19 & 0x1fU));
    local_e8 = -1 << (~(byte)local_bc & 0x1f);
    local_c0 = local_e8 & local_e4;
    local_dc = ((int)(uVar19 + w) >> 5) - 1;
  }
  local_b8 = local_b8 + ((int)uVar5 >> 5);
  iVar15 = local_84 + 1;
  pDVar1 = local_b0 + 1;
  local_84 = iVar15;
  if (num_gray <= iVar15) {
    local_84 = 0;
  }
  local_b0 = local_b0 + -(long)(num_gray + -1);
  if (iVar15 < num_gray) {
    local_b0 = pDVar1;
  }
  bVar2 = h < 2;
  h = iVar22 + -1;
  if (bVar2) {
    return;
  }
  goto LAB_0010a94e;
}

Assistant:

void bitblt(DLword *srcbase, DLword *dstbase, int sx, int dx, int w, int h, int srcbpl, int dstbpl,
            int backwardflg, int src_comp, int op, int gray, int num_gray, int curr_gray_line) {
  new_bitblt_code;
}